

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::handleNonExpr
          (RunContext *this,AssertionInfo *info,OfType resultType,AssertionReaction *reaction)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  char *pcVar4;
  size_t sVar5;
  size_type sVar6;
  int iVar7;
  bool bVar8;
  AssertionResult assertionResult;
  AssertionResultData data;
  AssertionResult AStack_118;
  AssertionResultData local_88;
  
  (this->m_lastAssertionInfo).resultDisposition = info->resultDisposition;
  pcVar2 = (info->macroName).m_start;
  sVar3 = (info->macroName).m_size;
  pcVar4 = (info->lineInfo).file;
  sVar5 = (info->lineInfo).line;
  sVar6 = (info->capturedExpression).m_size;
  (this->m_lastAssertionInfo).capturedExpression.m_start = (info->capturedExpression).m_start;
  (this->m_lastAssertionInfo).capturedExpression.m_size = sVar6;
  (this->m_lastAssertionInfo).lineInfo.file = pcVar4;
  (this->m_lastAssertionInfo).lineInfo.line = sVar5;
  (this->m_lastAssertionInfo).macroName.m_start = pcVar2;
  (this->m_lastAssertionInfo).macroName.m_size = sVar3;
  LazyExpression::LazyExpression((LazyExpression *)&AStack_118,false);
  AssertionResultData::AssertionResultData(&local_88,resultType,(LazyExpression *)&AStack_118);
  AssertionResult::AssertionResult(&AStack_118,info,&local_88);
  assertionEnded(this,&AStack_118);
  if ((((undefined1)AStack_118.m_resultData.resultType & FailureBit) != Ok) &&
     ((AStack_118.m_info.resultDisposition & SuppressFail) == 0)) {
    iVar7 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[6])();
    reaction->shouldDebugBreak = SUB41(iVar7,0);
    uVar1 = (this->m_totals).assertions.failed;
    iVar7 = (*(((this->m_config).
                super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NonCopyable)._vptr_NonCopyable[9])();
    bVar8 = true;
    if (uVar1 < (ulong)(long)iVar7) {
      bVar8 = (bool)((char)(this->m_lastAssertionInfo).resultDisposition & Normal);
    }
    reaction->shouldThrow = bVar8;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)AStack_118.m_resultData.reconstructedExpression._M_dataplus._M_p !=
      &AStack_118.m_resultData.reconstructedExpression.field_2) {
    operator_delete(AStack_118.m_resultData.reconstructedExpression._M_dataplus._M_p,
                    AStack_118.m_resultData.reconstructedExpression.field_2._M_allocated_capacity +
                    1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)AStack_118.m_resultData.message._M_dataplus._M_p !=
      &AStack_118.m_resultData.message.field_2) {
    operator_delete(AStack_118.m_resultData.message._M_dataplus._M_p,
                    AStack_118.m_resultData.message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.reconstructedExpression._M_dataplus._M_p !=
      &local_88.reconstructedExpression.field_2) {
    operator_delete(local_88.reconstructedExpression._M_dataplus._M_p,
                    local_88.reconstructedExpression.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.message._M_dataplus._M_p != &local_88.message.field_2) {
    operator_delete(local_88.message._M_dataplus._M_p,
                    local_88.message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void RunContext::handleNonExpr(
            AssertionInfo const &info,
            ResultWas::OfType resultType,
            AssertionReaction &reaction
    ) {
        m_lastAssertionInfo = info;

        AssertionResultData data( resultType, LazyExpression( false ) );
        AssertionResult assertionResult{ info, data };
        assertionEnded( assertionResult );

        if( !assertionResult.isOk() )
            populateReaction( reaction );
    }